

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O1

void __thiscall
VariableData::VariableData
          (VariableData *this,Allocator *allocator,SynBase *source,ScopeData *scope,uint alignment,
          TypeBase *type,SynIdentifier *name,uint offset,uint uniqueId)

{
  uint uVar1;
  Node *dst;
  
  this->source = source;
  this->scope = scope;
  this->alignment = alignment;
  this->type = type;
  this->name = name;
  this->offset = offset;
  this->uniqueId = uniqueId;
  (this->users).allocator = allocator;
  (this->users).data = (this->users).little;
  (this->users).count = 0;
  (this->users).max = 8;
  (this->offsetUsers).allocator = allocator;
  (this->offsetUsers).bucketCount = 8;
  (this->offsetUsers).count = 0;
  dst = (this->offsetUsers).storage;
  (this->offsetUsers).data = dst;
  NULLC::fillMemory(dst,0,0x80);
  (this->regVmUsers).allocator = allocator;
  (this->regVmUsers).data = (this->regVmUsers).little;
  (this->regVmUsers).count = 0;
  (this->regVmUsers).max = 4;
  this->importModule = (ModuleData *)0x0;
  uVar1 = NULLC::GetStringHash((name->name).begin,(name->name).end);
  this->nameHash = uVar1;
  this->isReference = false;
  this->isReadonly = false;
  this->usedAsExternal = false;
  this->lookupOnly = false;
  this->lookupOnly = false;
  this->isAlloca = false;
  this->isVmAlloca = false;
  this->isVmRegSpill = false;
  if ((alignment != 0) && (offset % alignment != 0)) {
    __assert_fail("offset % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                  ,0xc2,
                  "VariableData::VariableData(Allocator *, SynBase *, ScopeData *, unsigned int, TypeBase *, SynIdentifier *, unsigned int, unsigned int)"
                 );
  }
  return;
}

Assistant:

VariableData(Allocator *allocator, SynBase *source, ScopeData *scope, unsigned alignment, TypeBase *type, SynIdentifier *name, unsigned offset, unsigned uniqueId): source(source), scope(scope), alignment(alignment), type(type), name(name), offset(offset), uniqueId(uniqueId), users(allocator), offsetUsers(allocator), regVmUsers(allocator)
	{
		importModule = NULL;

		nameHash = name->name.hash();

		isReference = false;
		isReadonly = false;

		usedAsExternal = false;

		lookupOnly = false;

		isAlloca = false;
		isVmAlloca = false;

		isVmRegSpill = false;

		if(alignment != 0)
			assert(offset % alignment == 0);
	}